

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:1175:3)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>
            *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>_2
  aVar1;
  int iVar2;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if ((this->maybeFunc).ptr.isSet == true) {
    aVar1 = (this->maybeFunc).ptr.field_1;
    (this->maybeFunc).ptr.isSet = false;
    do {
      iVar2 = fchdir(*(int *)aVar1);
      if (-1 < iVar2) {
        iVar2 = 0;
        break;
      }
      iVar2 = Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      local_30.exception = (Exception *)0x0;
      local_28 = 0;
      uStack_20 = 0;
      Debug::Fault::init(&local_30,
                         (EVP_PKEY_CTX *)
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                        );
      Debug::Fault::fatal(&local_30);
    }
  }
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }